

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_setopt(nn_sock *self,int level,int option,void *optval,size_t optvallen)

{
  int iVar1;
  int rc;
  size_t optvallen_local;
  void *optval_local;
  int option_local;
  int level_local;
  nn_sock *self_local;
  
  nn_ctx_enter(&self->ctx);
  iVar1 = nn_sock_setopt_inner(self,level,option,optval,optvallen);
  nn_ctx_leave(&self->ctx);
  return iVar1;
}

Assistant:

int nn_sock_setopt (struct nn_sock *self, int level, int option,
    const void *optval, size_t optvallen)
{
    int rc;

    nn_ctx_enter (&self->ctx);
    rc = nn_sock_setopt_inner (self, level, option, optval, optvallen);
    nn_ctx_leave (&self->ctx);

    return rc;
}